

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.c
# Opt level: O0

void swap(char *a,char *b,size_t size)

{
  char cVar1;
  char t;
  size_t i;
  size_t size_local;
  char *b_local;
  char *a_local;
  
  b_local = b;
  a_local = a;
  for (i = 0; i < size; i = i + 1) {
    cVar1 = *a_local;
    *a_local = *b_local;
    *b_local = cVar1;
    a_local = a_local + 1;
    b_local = b_local + 1;
  }
  return;
}

Assistant:

static void
swap (char *a, char *b, size_t size)
{
  size_t i;

  for (i = 0; i < size; i++, a++, b++)
    {
      char t;

      t = *a;
      *a = *b;
      *b = t;
    }
}